

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_reserve.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator<char> local_69;
  vector<Foo,_std::allocator<Foo>_> v;
  string local_50;
  undefined1 local_30 [40];
  
  v.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"hello",&local_69);
  Foo::Foo((Foo *)local_30,1,&local_50);
  std::vector<Foo,_std::allocator<Foo>_>::emplace_back<Foo>(&v,(Foo *)local_30);
  std::__cxx11::string::~string((string *)(local_30 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  local_30._0_4_ = 3;
  std::vector<Foo,std::allocator<Foo>>::emplace_back<int,char_const(&)[6]>
            ((vector<Foo,std::allocator<Foo>> *)&v,(int *)local_30,(char (*) [6])"world");
  std::vector<Foo,_std::allocator<Foo>_>::~vector(&v);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    vector<Foo> v;
    // v.reserve(2);
    v.push_back(Foo(1, "hello"));

    v.emplace_back(3, "world");

    return 0;
}